

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

bool __thiscall glu::ES2ContextInfo::isVertexDynamicLoopSupported(ES2ContextInfo *this)

{
  bool bVar1;
  
  if ((this->m_vertexDynamicLoopsSupported).m_isComputed == false) {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_vertexDynamicLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_vertexDynamicLoopsSupported).m_value = bVar1;
    (this->m_vertexDynamicLoopsSupported).m_isComputed = true;
  }
  return (this->m_vertexDynamicLoopsSupported).m_value;
}

Assistant:

bool								isVertexDynamicLoopSupported		(void) const	{ return m_vertexDynamicLoopsSupported.getValue(m_context);		}